

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helper.cpp
# Opt level: O1

bool SHOPManagement::Helper::saveFileByLine
               (string *file_path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *t_data)

{
  int iVar1;
  pointer pbVar2;
  pointer pcVar3;
  char cVar4;
  ostream *poVar5;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> line;
  ofstream file_data;
  long *local_248;
  long local_240;
  long local_238 [2];
  long local_228;
  filebuf local_220 [24];
  int aiStack_208 [54];
  ios_base local_130 [264];
  
  std::ofstream::ofstream((ostream *)&local_228,(string *)file_path,_S_out);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    pbVar6 = (t_data->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (t_data->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar6 != pbVar2) {
      do {
        pcVar3 = (pbVar6->_M_dataplus)._M_p;
        local_248 = local_238;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_248,pcVar3,pcVar3 + pbVar6->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,(char *)local_248,local_240);
        cVar4 = (char)(ostream *)&local_228;
        std::ios::widen((char)*(undefined8 *)(local_228 + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        if (local_248 != local_238) {
          operator_delete(local_248,local_238[0] + 1);
        }
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar2);
    }
    std::ofstream::close();
    iVar1 = *(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18));
    local_228 = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_220);
    std::ios_base::~ios_base(local_130);
    return iVar1 == 0;
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(file_path->_M_dataplus)._M_p,
                      file_path->_M_string_length);
  std::operator<<(poVar5," can\'t open!");
  exit(1);
}

Assistant:

bool Helper::saveFileByLine(const std::string &file_path, const std::vector<std::string> &t_data)
    {
        std::ofstream file_data(file_path);

        if (!file_data.is_open())
        {
            std::cerr << file_path << " can't open!";
            exit(EXIT_FAILURE);
        }

        for (auto line : t_data)
        {
            file_data << line;
            file_data << std::endl;
        }

        file_data.close();
        return file_data.good();
    }